

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_BinaryLogicalExpr_Test::TestBody(ExprTest_BinaryLogicalExpr_Test *this)

{
  bool bVar1;
  LogicalConstant lhs_00;
  ExprFactory *this_00;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_78;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertHelper local_40;
  LogicalConstant rhs;
  LogicalConstant lhs;
  ExprBase local_28;
  
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  this_00 = &(this->super_ExprTest).factory_;
  lhs_00 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,true);
  lhs.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)lhs_00;
  rhs = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,false);
  local_28.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>>::
               MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                         ((BasicExprFactory<std::allocator<char>> *)this_00,AND,
                          (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                          lhs_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                          super_ExprBase.impl_,
                          (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                          rhs.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase
                          .impl_);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = (ExprBase)local_28.impl_ != (ExprBase)0x0;
  if ((ExprBase)local_28.impl_ == (ExprBase)0x0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"e != 0","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x197
               ,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1._0_4_ = 0x33;
  local_78.data_._0_4_ = (local_28.impl_)->kind_;
  testing::internal::CmpHelperEQ<mp::expr::Kind,mp::expr::Kind>
            ((internal *)&gtest_ar_,"expr::AND","e.kind()",(Kind *)&gtest_ar__1,(Kind *)&local_78);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x198
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1._0_8_ =
       mp::
       BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
       ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              *)&local_28);
  testing::internal::
  CmpHelperEQ<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&gtest_ar_,"lhs","e.lhs()",&lhs,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&gtest_ar__1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x199
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1._0_8_ =
       mp::
       BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
       ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              *)&local_28);
  testing::internal::
  CmpHelperEQ<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&gtest_ar_,"rhs","e.rhs()",&rhs,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&gtest_ar__1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x19a
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if (gtest_ar__1.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"invalid expression kind",(allocator<char> *)&local_78);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_RELATIONAL,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                 lhs.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                 rhs.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar__1,
               (char (*) [132])
               "Expected: factory_.MakeBinaryLogical(expr::LT, lhs, rhs) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (gtest_ar__1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x19c,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  testing::AssertionSuccess();
  if (gtest_ar__1.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"invalid argument",(allocator<char> *)&local_78);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                ((BasicExprFactory<std::allocator<char>> *)this_00,AND,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)0x0,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                 rhs.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar__1,
               (char (*) [143])
               "Expected: factory_.MakeBinaryLogical(expr::AND, LogicalExpr(), rhs) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (gtest_ar__1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x19e,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  testing::AssertionSuccess();
  if (gtest_ar__1.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"invalid argument",(allocator<char> *)&local_78);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                ((BasicExprFactory<std::allocator<char>> *)this_00,AND,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                 lhs.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)0x0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar__1,
               (char (*) [143])
               "Expected: factory_.MakeBinaryLogical(expr::AND, lhs, LogicalExpr()) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (gtest_ar__1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1a0,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  return;
}

Assistant:

TEST_F(ExprTest, BinaryLogicalExpr) {
  mp::BinaryLogicalExpr e;
  EXPECT_TRUE(e == 0);
  (void)LogicalExpr(e);
  auto lhs = factory_.MakeLogicalConstant(true);
  auto rhs = factory_.MakeLogicalConstant(false);
  e = factory_.MakeBinaryLogical(expr::AND, lhs, rhs);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::AND, e.kind());
  EXPECT_EQ(lhs, e.lhs());
  EXPECT_EQ(rhs, e.rhs());
  EXPECT_ASSERT(factory_.MakeBinaryLogical(expr::LT, lhs, rhs),
                "invalid expression kind");
  EXPECT_ASSERT(factory_.MakeBinaryLogical(expr::AND, LogicalExpr(), rhs),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeBinaryLogical(expr::AND, lhs, LogicalExpr()),
                "invalid argument");
}